

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_file.c
# Opt level: O3

char * p2sc_read_line(p2sc_iofile_t *f)

{
  int iVar1;
  char *fmt;
  char *line;
  GError *err;
  gsize term;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined8 in_stack_ffffffffffffffc8;
  undefined4 uVar5;
  undefined8 uVar4;
  char *local_30;
  long local_28;
  long local_20;
  
  uVar5 = (undefined4)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  local_30 = (char *)0x0;
  local_28 = 0;
  iVar1 = g_io_channel_read_line(f->io,&local_30,0,&local_20,&local_28);
  if ((local_28 == 0) || (*(long *)(local_28 + 8) == 0)) {
    if (0xfffffffd < iVar1 - 3U) {
      if (local_30 == (char *)0x0) {
        local_30 = (char *)0x0;
      }
      else if ((local_30[local_20] == '\r') || (local_30[local_20] == '\n')) {
        local_30[local_20] = '\0';
      }
      f->lineno = f->lineno + 1;
      return local_30;
    }
    g_free(local_30);
    uVar2 = *(undefined4 *)&f->name;
    uVar3 = (undefined4)f->lineno;
    uVar4 = CONCAT44(uVar5,iVar1);
    fmt = "%s:%zd: read failed with status: %d";
    iVar1 = 0xb5;
  }
  else {
    g_free(local_30);
    uVar2 = *(undefined4 *)&f->name;
    uVar3 = (undefined4)f->lineno;
    uVar4 = *(undefined8 *)(local_28 + 8);
    fmt = "%s:%zd: error reading: %s";
    iVar1 = 0xad;
  }
  local_30 = (char *)0x0;
  _p2sc_msg("p2sc_read_line",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_file.c"
            ,iVar1,"$Id: p2sc_file.c 5108 2014-06-19 12:29:23Z bogdan $",0x1068,fmt,uVar2,uVar3,
            uVar4);
  exit(1);
}

Assistant:

char *p2sc_read_line(p2sc_iofile_t *f) {
    gsize term;
    char *line = NULL;
    GError *err = NULL;
    GIOStatus status = g_io_channel_read_line(f->io, &line, NULL, &term, &err);

    if (err && err->message) {
        g_free(line);
        line = NULL;
        P2SC_Msg(LVL_FATAL_FILESYSTEM, "%s:%zd: error reading: %s", f->name,
                 f->lineno, err->message);
        g_error_free(err);
    }

    if (status != G_IO_STATUS_NORMAL && status != G_IO_STATUS_EOF) {
        g_free(line);
        line = NULL;
        P2SC_Msg(LVL_FATAL_FILESYSTEM, "%s:%zd: read failed with status: %d",
                 f->name, f->lineno, (int) status);
    }

    if (line && (line[term] == '\n' || line[term] == '\r'))
        line[term] = 0;

    f->lineno++;

    return line;
}